

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O0

WebSocketMsg __thiscall asl::WebSocket::receive(WebSocket *this)

{
  uchar uVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Socket *this_00;
  longlong lVar7;
  uchar *puVar8;
  WebSocketMsg *pWVar9;
  uint *in_RCX;
  WebSocket *in_RSI;
  ulong uVar10;
  int in_R8D;
  WebSocketMsg local_68;
  int local_60;
  int local_5c;
  int i;
  int n;
  uint mask;
  int len;
  bool masked;
  int opcode;
  byte local_3e;
  bool fin;
  byte mlen;
  byte b0;
  Array<unsigned_char> local_30;
  ByteArray buffer;
  bool haveMsg;
  WebSocketMsg msg;
  WebSocket *this_local;
  
  WebSocketMsg::WebSocketMsg((WebSocketMsg *)&stack0xffffffffffffffe0);
  buffer._a._7_1_ = 0;
  do {
    if (((buffer._a._7_1_ ^ 0xff) & 1) == 0) {
      pWVar9 = WebSocketMsg::fix((WebSocketMsg *)&stack0xffffffffffffffe0);
      WebSocketMsg::WebSocketMsg((WebSocketMsg *)this,pWVar9);
      opcode = 1;
      break;
    }
    Array<unsigned_char>::Array(&local_30);
    DEBUG_LOG("receive\n");
    bVar2 = closed(in_RSI);
    if (bVar2) {
      pWVar9 = WebSocketMsg::fix((WebSocketMsg *)&stack0xffffffffffffffe0);
      WebSocketMsg::WebSocketMsg((WebSocketMsg *)this,pWVar9);
      opcode = 1;
    }
    else {
      uVar4 = Socket::available(&in_RSI->_socket);
      DEBUG_LOG("avail %i\n",(ulong)uVar4);
      this_00 = Socket::operator>>(&in_RSI->_socket,&fin);
      Socket::operator>>(this_00,&local_3e);
      DEBUG_LOG("%i %i\n",(ulong)fin,(ulong)local_3e);
      bVar2 = closed(in_RSI);
      if (bVar2) {
        pWVar9 = WebSocketMsg::fix((WebSocketMsg *)&stack0xffffffffffffffe0);
        WebSocketMsg::WebSocketMsg((WebSocketMsg *)this,pWVar9);
        opcode = 1;
      }
      else {
        masked = (fin & 0x80U) != 0;
        len = fin & 0xf;
        mask._3_1_ = (local_3e & 0x80) != 0;
        n = local_3e & 0x7f;
        if (n == 0x7e) {
          uVar3 = Socket::read<unsigned_short>(&in_RSI->_socket);
          n = (int)uVar3;
        }
        else if (n == 0x7f) {
          lVar7 = Socket::read<long_long>(&in_RSI->_socket);
          n = (int)lVar7;
        }
        i = 0;
        if ((mask._3_1_ & 1) != 0) {
          Socket::operator>>(&in_RSI->_socket,(uint *)&i);
        }
        iVar5 = Array<unsigned_char>::length(&local_30);
        Array<unsigned_char>::resize(&local_30,iVar5 + n);
        if (0 < n) {
          puVar8 = Array<unsigned_char>::data(&local_30);
          iVar5 = Array<unsigned_char>::length(&local_30);
          Socket::read(&in_RSI->_socket,((int)puVar8 + iVar5) - n,(void *)(ulong)(uint)n,
                       (size_t)in_RCX);
        }
        iVar5 = len;
        DEBUG_LOG("frame: op %i fin %i len %i\n",(ulong)(uint)len,(ulong)(masked & 1));
        if ((mask._3_1_ & 1) != 0) {
          swapBytes<unsigned_int>((uint *)&i);
          iVar5 = Array<unsigned_char>::length(&local_30);
          Array<unsigned_char>::resize(&local_30,iVar5 + 4);
          iVar5 = Array<unsigned_char>::length(&local_30);
          uVar10 = (ulong)(iVar5 - 4U);
          Array<unsigned_char>::resize(&local_30,iVar5 - 4U);
          iVar5 = Array<unsigned_char>::length(&local_30);
          local_5c = iVar5 / 4 + 1;
          for (local_60 = 0; iVar6 = i, iVar5 = (int)uVar10, local_60 < local_5c;
              local_60 = local_60 + 1) {
            puVar8 = Array<unsigned_char>::data(&local_30);
            *(uint *)(puVar8 + (long)local_60 * 4) = iVar6 ^ *(uint *)(puVar8 + (long)local_60 * 4);
          }
        }
        in_RCX = &switchD_0014c7e4::switchdataD_0017676c;
        switch(len) {
        case 0:
        case 1:
        case 2:
          WebSocketMsg::append((WebSocketMsg *)&stack0xffffffffffffffe0,&local_30);
          break;
        case 8:
          iVar6 = Array<unsigned_char>::length(&local_30);
          if (1 < iVar6) {
            puVar8 = Array<unsigned_char>::operator[](&local_30,0);
            uVar1 = *puVar8;
            puVar8 = Array<unsigned_char>::operator[](&local_30,1);
            in_RCX = (uint *)(ulong)(uint)CONCAT11(uVar1,*puVar8);
            in_RSI->_code = (uint)CONCAT11(uVar1,*puVar8);
            Array<unsigned_char>::remove(&local_30,(char *)0x0);
            WebSocketMsg::WebSocketMsg(&local_68,&local_30);
            pWVar9 = &local_68;
            WebSocketMsg::operator=((WebSocketMsg *)&stack0xffffffffffffffe0,pWVar9);
            iVar5 = (int)pWVar9;
            WebSocketMsg::~WebSocketMsg(&local_68);
          }
          buffer._a._7_1_ = 1;
          in_RSI->_closed = true;
          Socket::close(&in_RSI->_socket,iVar5);
          break;
        case 9:
          puVar8 = Array<unsigned_char>::data(&local_30);
          uVar4 = Array<unsigned_char>::length(&local_30);
          in_RCX = (uint *)0xa;
          send(in_RSI,(int)puVar8,(void *)(ulong)uVar4,10,in_R8D);
          break;
        case 10:
          Array<unsigned_char>::clear(&local_30);
        }
        if ((masked & 1U) != 0) {
          buffer._a._7_1_ = 1;
        }
        opcode = 0;
      }
    }
    Array<unsigned_char>::~Array(&local_30);
  } while (opcode == 0);
  WebSocketMsg::~WebSocketMsg((WebSocketMsg *)&stack0xffffffffffffffe0);
  return (WebSocketMsg)(ByteArray)this;
}

Assistant:

WebSocketMsg WebSocket::receive()
{
	WebSocketMsg msg;
	bool haveMsg = false;
	while (!haveMsg)
	{
		ByteArray buffer;
		byte b0, mlen;
		DEBUG_LOG("receive\n");
		if (closed()) {
			return msg.fix();
		}
		DEBUG_LOG("avail %i\n", _socket.available());
		_socket >> b0 >> mlen;
		DEBUG_LOG("%i %i\n", b0, mlen);
		if (closed()) {
			return msg.fix();
		}
		bool fin = !!(b0 & 0x80);
		int opcode = b0 & 0x0f;
		bool masked = !!(mlen & 0x80);
		int len = mlen & 0x7f;
		if (len == 126)
		{
			len = _socket.read<unsigned short>();
		}
		else if (len == 127)
			len = (int)_socket.read<Long>(); // what if length larger than int?

		unsigned mask = 0;
		if (masked)
			_socket >> mask;

		buffer.resize(buffer.length() + len);
		if (len > 0)
			_socket.read(buffer.data() + buffer.length() - len, len);

		DEBUG_LOG("frame: op %i fin %i len %i\n", opcode, fin ? 1 : 0, (int)len);

		if (masked)
		{
			swapBytes(mask);
			buffer.resize(buffer.length() + 4);
			buffer.resize(buffer.length() - 4);
			int n = buffer.length() / 4 + 1;
			for (int i = 0; i < n; i++)
			{
				((unsigned*)buffer.data())[i] ^= mask;
			}
		}

		switch (opcode)
		{
		case 0: // continuation
		case 1: // text
		case 2: // binary
			msg.append(buffer);
			break;
		case 8: // connection close
		{
			if (buffer.length() >= 2) {
				_code = (buffer[0] << 8) | buffer[1];
				buffer.remove(0, 2);
				msg = buffer;
			}
			haveMsg = true;
			_closed = true;
			_socket.close();
			break;
		}
		case 9: // ping
			send(buffer.data(), buffer.length(), FRAME_PONG);
			break;
		case 10: // pong
			buffer.clear();
			break;
		}

		if (fin)
			haveMsg = true;
	}

	return msg.fix();
}